

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O2

int Tru_ManInsert(Tru_Man_t *p,word *pTruth)

{
  Vec_Set_t *pVVar1;
  uint *puVar2;
  word **__ptr;
  word *pwVar3;
  Tru_One_t *pTVar4;
  byte bVar5;
  int w;
  int iVar6;
  ulong uVar7;
  uint h;
  word wVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar11 = (ulong)(uint)p->nWords;
  if (p->nWords < 1) {
    uVar11 = 0;
  }
  uVar7 = 0;
  do {
    if (uVar11 == uVar7) {
      return 0;
    }
    pwVar3 = pTruth + uVar7;
    uVar7 = uVar7 + 1;
  } while (*pwVar3 == 0);
  uVar7 = 0;
  do {
    if (uVar11 == uVar7) {
      return 1;
    }
    pwVar3 = pTruth + uVar7;
    uVar7 = uVar7 + 1;
  } while (*pwVar3 == 0xffffffffffffffff);
  p->nTableLookups = p->nTableLookups + 1;
  if (p->nTableSize * 2 < p->pMem->nEntries) {
    Tru_ManResize(p);
  }
  uVar12 = (uint)*pTruth & 1;
  if (uVar12 != 0) {
    Tru_ManNot(pTruth,p->nWords);
  }
  puVar2 = (uint *)Tru_ManLookup(p,pTruth);
  if (*puVar2 == 0) {
    pVVar1 = p->pMem;
    iVar9 = p->nEntrySize + 1 >> 1;
    bVar5 = (byte)pVVar1->nPageSize;
    iVar6 = 1 << (bVar5 & 0x1f);
    if (iVar6 <= iVar9) {
      __assert_fail("nWords < (1 << p->nPageSize)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecSet.h"
                    ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
    }
    pVVar1->nEntries = pVVar1->nEntries + 1;
    __ptr = pVVar1->pPages;
    iVar10 = pVVar1->iPage;
    pwVar3 = __ptr[iVar10];
    wVar8 = *pwVar3;
    if (iVar6 <= iVar9 + (int)wVar8) {
      uVar11 = (long)iVar10 + 1;
      pVVar1->iPage = (int)uVar11;
      if ((int)uVar11 == pVVar1->nPagesAlloc) {
        __ptr = (word **)realloc(__ptr,uVar11 * 0x10);
        pVVar1->pPages = __ptr;
        iVar6 = pVVar1->nPagesAlloc;
        memset(__ptr + iVar6,0,(long)iVar6 << 3);
        pVVar1->nPagesAlloc = iVar6 * 2;
        bVar5 = (byte)pVVar1->nPageSize;
        uVar11 = (ulong)(uint)pVVar1->iPage;
      }
      iVar10 = (int)uVar11;
      pwVar3 = __ptr[iVar10];
      if (pwVar3 == (word *)0x0) {
        pwVar3 = (word *)malloc((long)(1 << (bVar5 & 0x1f)) << 3);
        __ptr[iVar10] = pwVar3;
        pwVar3 = pVVar1->pPages[iVar10];
      }
      *pwVar3 = 2;
      pwVar3[1] = 0xffffffffffffffff;
      wVar8 = 2;
    }
    *pwVar3 = (long)iVar9 + wVar8;
    h = ((int)((long)iVar9 + wVar8) - iVar9) + (iVar10 << (bVar5 & 0x1f));
    *puVar2 = h;
    if ((h & 1) != 0) {
      __assert_fail("(*pSpot & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                    ,0xb0,"int Tru_ManInsert(Tru_Man_t *, word *)");
    }
    pTVar4 = Tru_ManReadOne(p,h);
    uVar7 = 0;
    uVar11 = (ulong)(uint)p->nWords;
    if (p->nWords < 1) {
      uVar11 = uVar7;
    }
    for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
      pTVar4[uVar7 + 1] = *(Tru_One_t *)(pTruth + uVar7);
    }
    pTVar4->Handle = h;
    pTVar4->Next = 0;
  }
  if (uVar12 != 0) {
    Tru_ManNot(pTruth,p->nWords);
  }
  return uVar12 ^ *puVar2;
}

Assistant:

int Tru_ManInsert( Tru_Man_t * p, word * pTruth )
{
    int fCompl, * pSpot;
    if ( Tru_ManEqual0(pTruth, p->nWords) )
        return 0;
    if ( Tru_ManEqual1(pTruth, p->nWords) )
        return 1;
    p->nTableLookups++;
    if ( Vec_SetEntryNum(p->pMem) > 2 * p->nTableSize )
        Tru_ManResize( p );
    fCompl = pTruth[0] & 1;
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    pSpot = Tru_ManLookup( p, pTruth );
    if ( *pSpot == 0 )
    {
        Tru_One_t * pEntry;
        *pSpot = Vec_SetAppend( p->pMem, NULL, p->nEntrySize );
        assert( (*pSpot & 1) == 0 );
        pEntry = Tru_ManReadOne( p, *pSpot );
        Tru_ManCopy( pEntry->pTruth, pTruth, p->nWords );
        pEntry->Handle = *pSpot;
        pEntry->Next = 0;
    }
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    return *pSpot ^ fCompl;
}